

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O0

void drawhand(double ang,float (*v) [2],Fl_Color fill,Fl_Color line)

{
  int local_24;
  int i;
  Fl_Color line_local;
  Fl_Color fill_local;
  float (*v_local) [2];
  double ang_local;
  
  fl_push_matrix();
  fl_rotate(ang);
  fl_color(fill);
  fl_begin_polygon();
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    fl_vertex((double)v[local_24][0],(double)v[local_24][1]);
  }
  fl_end_polygon();
  fl_color(line);
  fl_begin_loop();
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    fl_vertex((double)v[local_24][0],(double)v[local_24][1]);
  }
  fl_end_loop();
  fl_pop_matrix();
  return;
}

Assistant:

static void drawhand(double ang,const float v[][2],Fl_Color fill,Fl_Color line)
{
  fl_push_matrix();
  fl_rotate(ang);
  fl_color(fill);
  fl_begin_polygon();
  int i; for (i=0; i<4; i++) fl_vertex(v[i][0],v[i][1]);
  fl_end_polygon();
  fl_color(line);
  fl_begin_loop();
  for (i=0; i<4; i++) fl_vertex(v[i][0],v[i][1]);
  fl_end_loop();
  fl_pop_matrix();
}